

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O0

void gravity_compiler_reset(gravity_compiler_t *compiler,_Bool free_core)

{
  char *local_40;
  char *local_38;
  char *val;
  size_t _i;
  size_t _len;
  _Bool free_core_local;
  gravity_compiler_t *compiler_local;
  
  if (compiler->storage != (cstring_r *)0x0) {
    if (compiler->storage == (cstring_r *)0x0) {
      local_38 = (char *)0x0;
    }
    else {
      local_38 = (char *)compiler->storage->n;
    }
    for (val = (char *)0x0; val < local_38; val = val + 1) {
      if (val < (char *)compiler->storage->n) {
        local_40 = compiler->storage->p[(long)val];
      }
      else {
        local_40 = (char *)0x0;
      }
      free(local_40);
    }
    if (compiler->storage->p != (char **)0x0) {
      free(compiler->storage->p);
    }
    free(compiler->storage);
  }
  if (compiler->ast != (gnode_t *)0x0) {
    gnode_free(compiler->ast);
  }
  if (compiler->parser != (gravity_parser_t *)0x0) {
    gravity_parser_free(compiler->parser);
  }
  if (compiler->vm != (gravity_vm *)0x0) {
    gravity_vm_free(compiler->vm);
  }
  if (compiler->objects != (void_r *)0x0) {
    if (compiler->objects->p != (void **)0x0) {
      free(compiler->objects->p);
    }
    free(compiler->objects);
  }
  if (free_core) {
    gravity_core_free();
  }
  compiler->vm = (gravity_vm *)0x0;
  compiler->ast = (gnode_t *)0x0;
  compiler->parser = (gravity_parser_t *)0x0;
  compiler->objects = (void_r *)0x0;
  compiler->storage = (cstring_r *)0x0;
  return;
}

Assistant:

static void gravity_compiler_reset (gravity_compiler_t *compiler, bool free_core) {
    // free memory for array of strings storage
    if (compiler->storage) {
        cstring_array_each(compiler->storage, {mem_free((void *)val);});
        gnode_array_free(compiler->storage);
    }

    // first ast then parser, don't change the release order
    if (compiler->ast) gnode_free(compiler->ast);
    if (compiler->parser) gravity_parser_free(compiler->parser);

    // at the end free mini VM and objects array
    if (compiler->vm) gravity_vm_free(compiler->vm);
    if (compiler->objects) {
        marray_destroy(*compiler->objects);
        mem_free((void*)compiler->objects);
    }

    // feel free to free core if someone requires it
    if (free_core) gravity_core_free();

    // reset internal pointers
    compiler->vm = NULL;
    compiler->ast = NULL;
    compiler->parser = NULL;
    compiler->objects = NULL;
    compiler->storage = NULL;
}